

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxShift::Emit(FxShift *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  ExpEmit EVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ExpEmit EVar5;
  int local_80;
  int local_7c;
  undefined1 local_58 [28];
  ExpEmit local_3c;
  ExpEmit op2;
  ExpEmit op1;
  int rop;
  int instr;
  int index;
  VMFunctionBuilder *build_local;
  FxShift *this_local;
  ExpEmit to;
  undefined4 extraout_var_00;
  
  iVar3 = PType::GetRegType(((this->super_FxBinary).left)->ValueType);
  if (iVar3 != 0) {
    __assert_fail("left->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xeb9,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  iVar3 = PType::GetRegType(((this->super_FxBinary).right)->ValueType);
  if (iVar3 != 0) {
    __assert_fail("right->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xeba,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::ExpEmit(&op2);
  ExpEmit::ExpEmit(&local_3c);
  if ((this->super_FxBinary).Operator == 0x118) {
    local_7c = 0;
  }
  else {
    if ((this->super_FxBinary).Operator == 0x116) {
      local_80 = 1;
    }
    else {
      local_80 = -1;
      if ((this->super_FxBinary).Operator == 0x117) {
        local_80 = 2;
      }
    }
    local_7c = local_80;
  }
  if (local_7c < 0) {
    __assert_fail("index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xec7,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  pFVar1 = (this->super_FxBinary).left;
  local_58._20_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  local_58[0x18] = (bool)(char)extraout_var;
  local_58[0x19] = (bool)(char)((uint)extraout_var >> 8);
  local_58[0x1a] = (bool)(char)((uint)extraout_var >> 0x10);
  local_58[0x1b] = (bool)(char)((uint)extraout_var >> 0x18);
  op2 = (ExpEmit)local_58._20_8_;
  uVar4 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
  if ((uVar4 & 1) == 0) {
    pFVar1 = (this->super_FxBinary).right;
    EVar5._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
    EVar5.Konst = (bool)(char)extraout_var_00;
    EVar5.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
    EVar5.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
    EVar5.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
    local_3c.Konst = SUB41(extraout_var_00,0);
    local_3c = EVar5;
    if (((local_3c.Konst ^ 0xffU) & 1) == 0) {
      __assert_fail("!op2.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xed3,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
    }
    ExpEmit::Free(&local_3c,build);
    op1._0_4_ = ZEXT24(local_3c.RegNum);
  }
  else {
    FxConstant::GetValue((FxConstant *)local_58);
    op1._0_4_ = ExpVal::GetInt((ExpVal *)local_58);
    ExpVal::~ExpVal((ExpVal *)local_58);
    local_3c.Konst = true;
  }
  if (((ulong)op2 & 0x100000000) == 0) {
    ExpEmit::Free(&op2,build);
    iVar3 = 0;
    if (((ulong)local_3c & 0x100000000) != 0) {
      iVar3 = 2;
    }
    op1.Konst = (bool)Emit::InstrMap[local_7c][iVar3];
  }
  else {
    if (((local_3c.Konst ^ 0xffU) & 1) == 0) {
      __assert_fail("!op2.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xedf,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
    }
    op1.Konst = (bool)Emit::InstrMap[local_7c][1];
  }
  op1.Fixed = false;
  op1.Final = false;
  op1.Target = false;
  if (op1._4_4_ == 0) {
    __assert_fail("instr != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xee2,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,0,1);
  VMFunctionBuilder::Emit(build,op1._4_4_,(uint)(ushort)this_local,(uint)op2.RegNum,op1._0_4_);
  EVar2.RegType = this_local._2_1_;
  EVar2.RegCount = this_local._3_1_;
  EVar2.Konst = (bool)this_local._4_1_;
  EVar2.Fixed = (bool)this_local._5_1_;
  EVar2.Final = (bool)this_local._6_1_;
  EVar2.Target = (bool)this_local._7_1_;
  EVar2.RegNum = (ushort)this_local;
  return EVar2;
}

Assistant:

ExpEmit FxShift::Emit(VMFunctionBuilder *build)
{
	assert(left->ValueType->GetRegType() == REGT_INT);
	assert(right->ValueType->GetRegType() == REGT_INT);
	static const VM_UBYTE InstrMap[][4] =
	{
		{ OP_SLL_RR, OP_SLL_KR, OP_SLL_RI },	// TK_LShift
		{ OP_SRA_RR, OP_SRA_KR, OP_SRA_RI },	// TK_RShift
		{ OP_SRL_RR, OP_SRL_KR, OP_SRL_RI },	// TK_URShift
	};
	int index, instr, rop;
	ExpEmit op1, op2;

	index = Operator == TK_LShift ? 0 :
			Operator == TK_RShift ? 1 :
			Operator == TK_URShift ? 2 : -1;
	assert(index >= 0);
	op1 = left->Emit(build);

	// Shift instructions use right-hand immediates instead of constant registers.
	if (right->isConstant())
	{
		rop = static_cast<FxConstant *>(right)->GetValue().GetInt();
		op2.Konst = true;
	}
	else
	{
		op2 = right->Emit(build);
		assert(!op2.Konst);
		op2.Free(build);
		rop = op2.RegNum;
	}

	if (!op1.Konst)
	{
		op1.Free(build);
		instr = InstrMap[index][op2.Konst? 2:0];
	}
	else
	{
		assert(!op2.Konst);
		instr = InstrMap[index][1];
	}
	assert(instr != 0);
	ExpEmit to(build, REGT_INT);
	build->Emit(instr, to.RegNum, op1.RegNum, rop);
	return to;
}